

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void __thiscall acto::core::runtime_t::~runtime_t(runtime_t *this)

{
  ~runtime_t(this);
  operator_delete(this,0x228);
  return;
}

Assistant:

runtime_t::~runtime_t() {
  terminating_ = true;
  // Дождаться, когда все потоки будут удалены
  queue_event_.signaled();
  no_workers_event_.wait();

  active_ = false;

  queue_event_.signaled();
  // Stop scheduler's thread.
  if (m_scheduler.joinable()) {
    m_scheduler.join();
  }

  assert(workers_.count == 0 && workers_.reserved == 0);
}